

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBMX055.cpp
# Opt level: O1

void __thiscall
RTIMUBMX055::processMagData(RTIMUBMX055 *this,uchar *v_data_u8,float *magX,float *magY,float *magZ)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  byte bVar4;
  uchar uVar5;
  byte bVar6;
  ushort data_r;
  float fVar7;
  
  bVar1 = *v_data_u8;
  *v_data_u8 = bVar1 >> 3;
  bVar2 = v_data_u8[2];
  v_data_u8[2] = bVar2 >> 3;
  uVar3 = v_data_u8[3];
  bVar4 = v_data_u8[4];
  v_data_u8[4] = bVar4 >> 1;
  uVar5 = v_data_u8[5];
  bVar6 = v_data_u8[6];
  v_data_u8[6] = bVar6 >> 2;
  data_r = (ushort)v_data_u8[7] << 6 | (ushort)(bVar6 >> 2);
  fVar7 = bmm050_compensate_X_float
                    (this,(short)(char)v_data_u8[1] << 5 | (ushort)(bVar1 >> 3),data_r);
  *magX = fVar7;
  fVar7 = bmm050_compensate_Y_float(this,(short)(char)uVar3 << 5 | (ushort)(bVar2 >> 3),data_r);
  *magY = fVar7;
  fVar7 = bmm050_compensate_Z_float(this,(short)(char)uVar5 << 7 | (ushort)(bVar4 >> 1),data_r);
  *magZ = fVar7;
  return;
}

Assistant:

void RTIMUBMX055::processMagData(unsigned char *v_data_u8, float& magX, float& magY, float& magZ)
{
    /* structure used to store the mag raw xyz and r data */
    struct {
        int16_t raw_data_x;
        int16_t raw_data_y;
        int16_t raw_data_z;
        int16_t raw_data_r;
    } raw_data_xyz_t;

    /* Reading data for X axis */
    v_data_u8[LSB_ZERO] = BMM050_GET_BITSLICE(v_data_u8[LSB_ZERO],
    BMM050_DATAX_LSB_VALUEX);
    raw_data_xyz_t.raw_data_x = (int16_t)((((int32_t)
    ((int8_t)v_data_u8[MSB_ONE])) <<
    SHIFT_LEFT_5_POSITION) | v_data_u8[LSB_ZERO]);

    /* Reading data for Y axis */
    v_data_u8[LSB_TWO] = BMM050_GET_BITSLICE(v_data_u8[LSB_TWO],
    BMM050_DATAY_LSB_VALUEY);
    raw_data_xyz_t.raw_data_y = (int16_t)((((int32_t)
    ((int8_t)v_data_u8[MSB_THREE])) <<
    SHIFT_LEFT_5_POSITION) | v_data_u8[LSB_TWO]);

    /* Reading data for Z axis */
    v_data_u8[LSB_FOUR] = BMM050_GET_BITSLICE(v_data_u8[LSB_FOUR],
    BMM050_DATAZ_LSB_VALUEZ);
    raw_data_xyz_t.raw_data_z = (int16_t)((((int32_t)
    ((int8_t)v_data_u8[MSB_FIVE])) <<
    SHIFT_LEFT_7_POSITION) | v_data_u8[LSB_FOUR]);

    /* Reading data for Resistance*/
    v_data_u8[LSB_SIX] = BMM050_GET_BITSLICE(v_data_u8[LSB_SIX],
    BMM050_R_LSB_VALUE);
    raw_data_xyz_t.raw_data_r = (uint16_t)((((uint32_t)
    v_data_u8[MSB_SEVEN]) <<
    SHIFT_LEFT_6_POSITION) | v_data_u8[LSB_SIX]);

    /* Compensation for X axis */
    magX = bmm050_compensate_X_float(
    raw_data_xyz_t.raw_data_x,
    raw_data_xyz_t.raw_data_r);

    /* Compensation for Y axis */
    magY = bmm050_compensate_Y_float(
    raw_data_xyz_t.raw_data_y,
    raw_data_xyz_t.raw_data_r);

    /* Compensation for Z axis */
    magZ = bmm050_compensate_Z_float(
    raw_data_xyz_t.raw_data_z,
    raw_data_xyz_t.raw_data_r);

    /* Output raw resistance value */
//    mag_data->resistance = raw_data_xyz_t.raw_data_r;

}